

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::PerfectHtThresholdSetting::SetLocal(ClientContext *context,Value *input)

{
  ulong val;
  unsigned_long uVar1;
  ClientConfig *pCVar2;
  ParserException *this;
  allocator local_39;
  string local_38;
  
  val = Value::GetValue<long>(input);
  if (val < 0x21) {
    uVar1 = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
    pCVar2 = ClientConfig::GetConfig(context);
    pCVar2->perfect_ht_threshold = uVar1;
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Perfect HT threshold out of range: should be within range 0 - 32",
             &local_39);
  ParserException::ParserException(this,&local_38);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PerfectHtThresholdSetting::SetLocal(ClientContext &context, const Value &input) {
	auto bits = input.GetValue<int64_t>();
	if (bits < 0 || bits > 32) {
		throw ParserException("Perfect HT threshold out of range: should be within range 0 - 32");
	}
	ClientConfig::GetConfig(context).perfect_ht_threshold = NumericCast<idx_t>(bits);
}